

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O2

Type GradientBase32::fetchSingle(QGradientData *gradient,qreal v)

{
  QRgb *pQVar1;
  uint uVar2;
  
  pQVar1 = gradient->colorTable32;
  uVar2 = qt_gradient_clamp(gradient,(int)(v * 1023.0 + 0.5));
  return pQVar1[uVar2];
}

Assistant:

static inline uint qt_gradient_pixel(const QGradientData *data, qreal pos)
{
    int ipos = int(pos * (GRADIENT_STOPTABLE_SIZE - 1) + qreal(0.5));
    return data->colorTable32[qt_gradient_clamp(data, ipos)];
}